

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O1

void __thiscall
kj::_::HeapDisposer<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>_>::
disposeImpl(HeapDisposer<kj::_::ImmediatePromiseNode<kj::Maybe<kj::Own<kj::AsyncCapabilityStream>_>_>_>
            *this,void *pointer)

{
  long *plVar1;
  
  if (pointer != (void *)0x0) {
    if ((*(char *)((long)pointer + 0x168) == '\x01') &&
       (plVar1 = *(long **)((long)pointer + 0x178), plVar1 != (long *)0x0)) {
      *(undefined8 *)((long)pointer + 0x178) = 0;
      (**(code **)**(undefined8 **)((long)pointer + 0x170))
                (*(undefined8 **)((long)pointer + 0x170),(long)plVar1 + *(long *)(*plVar1 + -0x10));
    }
    if (*(char *)((long)pointer + 8) == '\x01') {
      Exception::~Exception((Exception *)((long)pointer + 0x10));
    }
    ImmediatePromiseNodeBase::~ImmediatePromiseNodeBase((ImmediatePromiseNodeBase *)pointer);
    operator_delete(pointer,0x180);
    return;
  }
  return;
}

Assistant:

virtual void disposeImpl(void* pointer) const override { delete reinterpret_cast<T*>(pointer); }